

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O3

uchar * wal_dk_read_header(uchar *buffer,wal_dk_header *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uchar *puVar4;
  uint32_t uVar5;
  long lVar6;
  uchar *local_20;
  
  uVar1 = *(undefined8 *)(buffer + 4);
  uVar2 = *(undefined8 *)(buffer + 0xc);
  uVar3 = *(undefined8 *)(buffer + 0x1c);
  *(undefined8 *)(out->name + 0x10) = *(undefined8 *)(buffer + 0x14);
  *(undefined8 *)(out->name + 0x18) = uVar3;
  *(undefined8 *)out->name = uVar1;
  *(undefined8 *)(out->name + 8) = uVar2;
  local_20 = buffer + 0x24;
  uVar5 = read_le32(&local_20);
  out->width = uVar5;
  uVar5 = read_le32(&local_20);
  out->height = uVar5;
  lVar6 = 0;
  do {
    uVar5 = read_le32(&local_20);
    out->offsets[lVar6] = uVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 9);
  uVar1 = *(undefined8 *)local_20;
  uVar2 = *(undefined8 *)(local_20 + 8);
  uVar3 = *(undefined8 *)(local_20 + 0x18);
  *(undefined8 *)(out->animname + 0x10) = *(undefined8 *)(local_20 + 0x10);
  *(undefined8 *)(out->animname + 0x18) = uVar3;
  *(undefined8 *)out->animname = uVar1;
  *(undefined8 *)(out->animname + 8) = uVar2;
  local_20 = local_20 + 0x20;
  uVar5 = read_le32(&local_20);
  out->flags = uVar5;
  uVar5 = read_le32(&local_20);
  puVar4 = local_20;
  out->contents = uVar5;
  memcpy(out->palette,local_20,0x300);
  local_20 = puVar4 + 0x300;
  uVar5 = read_le32(&local_20);
  out->value = uVar5;
  return local_20;
}

Assistant:

unsigned char *wal_dk_read_header(const unsigned char *buffer,
								  struct wal_dk_header *out)
{
	int i;
	unsigned char *ptr = (unsigned char *)(buffer + 4);
	memcpy(&(out->name), ptr, NAME_LEN);
	ptr += NAME_LEN;
	out->width = read_le32(&ptr);
	out->height = read_le32(&ptr);
	for (i = 0; i < MIP_LEVELS_DK; i++) {
		out->offsets[i] = read_le32(&ptr);
	}
	memcpy(&(out->animname), ptr, NAME_LEN);
	ptr += NAME_LEN;
	out->flags = read_le32(&ptr);
	out->contents = read_le32(&ptr);
	memcpy(&(out->palette), ptr, DK_PALETTE_SIZE);
	ptr += DK_PALETTE_SIZE;
	out->value = read_le32(&ptr);
	return ptr;
}